

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandPrintIo(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pNode;
  char *pcVar2;
  uint fPrintFlops;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  fPrintFlops = 1;
  while (iVar1 = Extra_UtilGetopt(argc,argv,"fh"), iVar1 == 0x66) {
    fPrintFlops = fPrintFlops ^ 1;
  }
  if (iVar1 == -1) {
    if (pNtk == (Abc_Ntk_t *)0x0) {
      pcVar2 = "Empty network.\n";
      iVar1 = -1;
      goto LAB_001f01f2;
    }
    if (argc <= globalUtilOptind + 1) {
      if (globalUtilOptind + 1 != argc) {
        Abc_NtkPrintIo(_stdout,pNtk,fPrintFlops);
        return 0;
      }
      pNode = Abc_NtkFindNode(pNtk,argv[globalUtilOptind]);
      if (pNode == (Abc_Obj_t *)0x0) {
        Abc_Print(-1,"Cannot find node \"%s\".\n",argv[globalUtilOptind]);
        return 1;
      }
      Abc_NodePrintFanio(_stdout,pNode);
      return 0;
    }
    Abc_Print(-1,"Wrong number of auguments.\n");
  }
  iVar1 = -2;
  Abc_Print(-2,"usage: print_io [-fh] <node>\n");
  Abc_Print(-2,"\t        prints the PIs/POs/flops or fanins/fanouts of a node\n");
  pcVar2 = "yes";
  if (fPrintFlops == 0) {
    pcVar2 = "no";
  }
  Abc_Print(-2,"\t-f    : toggles printing flops [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h    : print the command usage\n");
  pcVar2 = "\tnode  : the node to print fanins/fanouts\n";
LAB_001f01f2:
  Abc_Print(iVar1,pcVar2);
  return 1;
}

Assistant:

int Abc_CommandPrintIo( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pNode;
    int c, fPrintFlops = 1;

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "fh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'f':
            fPrintFlops ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( argc > globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }

    if ( argc == globalUtilOptind + 1 )
    {
        pNode = Abc_NtkFindNode( pNtk, argv[globalUtilOptind] );
        if ( pNode == NULL )
        {
            Abc_Print( -1, "Cannot find node \"%s\".\n", argv[globalUtilOptind] );
            return 1;
        }
        Abc_NodePrintFanio( stdout, pNode );
        return 0;
    }
    // print the nodes
    Abc_NtkPrintIo( stdout, pNtk, fPrintFlops );
    return 0;

usage:
    Abc_Print( -2, "usage: print_io [-fh] <node>\n" );
    Abc_Print( -2, "\t        prints the PIs/POs/flops or fanins/fanouts of a node\n" );
    Abc_Print( -2, "\t-f    : toggles printing flops [default = %s]\n", fPrintFlops? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    Abc_Print( -2, "\tnode  : the node to print fanins/fanouts\n");
    return 1;
}